

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaFoodWeb_bnd.c
# Opt level: O0

void Fweb(sunrealtype tcalc,N_Vector cc,N_Vector crate,UserData webdata)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  sunrealtype xx_00;
  sunrealtype yy_00;
  sunrealtype *cxy_00;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunrealtype dcxui;
  sunrealtype dcxli;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype *cratexy;
  sunrealtype *ratesxy;
  sunrealtype *cxy;
  sunrealtype yy;
  sunrealtype xx;
  sunindextype idxl;
  sunindextype idxu;
  sunindextype idyl;
  sunindextype idyu;
  sunindextype is;
  sunindextype jy;
  sunindextype jx;
  UserData in_stack_ffffffffffffff70;
  sunrealtype *in_stack_ffffffffffffff78;
  long local_38;
  long local_30;
  long local_28;
  
  for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
    iVar1 = -0x28;
    if (local_30 != 0x13) {
      iVar1 = 0x28;
    }
    iVar2 = -0x28;
    if (local_30 != 0) {
      iVar2 = 0x28;
    }
    for (local_28 = 0; local_28 < 0x14; local_28 = local_28 + 1) {
      iVar3 = -2;
      if (local_28 != 0x13) {
        iVar3 = 2;
      }
      iVar4 = -2;
      if (local_28 != 0) {
        iVar4 = 2;
      }
      xx_00 = (sunrealtype)(*(long *)(*in_RDI + 0x10) + (local_28 * 2 + local_30 * 0x28) * 8);
      yy_00 = (sunrealtype)
              (*(long *)(**(long **)(in_RDX + 0x70) + 0x10) + (local_28 * 2 + local_30 * 0x28) * 8);
      cxy_00 = (sunrealtype *)(*(long *)(*in_RSI + 0x10) + (local_28 * 2 + local_30 * 0x28) * 8);
      WebRates(xx_00,yy_00,cxy_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        in_stack_ffffffffffffff78 =
             (sunrealtype *)
             (*(double *)((long)xx_00 + local_38 * 8) -
             *(double *)((long)xx_00 + (long)iVar2 * -8 + local_38 * 8));
        in_stack_ffffffffffffff70 =
             (UserData)
             (*(double *)((long)xx_00 + (long)iVar1 * 8 + local_38 * 8) -
             *(double *)((long)xx_00 + local_38 * 8));
        cxy_00[local_38] =
             *(double *)(in_RDX + 0x50 + local_38 * 8) *
             ((double)in_stack_ffffffffffffff70 - (double)in_stack_ffffffffffffff78) +
             *(double *)(in_RDX + 0x40 + local_38 * 8) *
             ((*(double *)((long)xx_00 + (long)iVar3 * 8 + local_38 * 8) -
              *(double *)((long)xx_00 + local_38 * 8)) -
             (*(double *)((long)xx_00 + local_38 * 8) -
             *(double *)((long)xx_00 + (long)iVar4 * -8 + local_38 * 8))) +
             *(double *)((long)yy_00 + local_38 * 8);
      }
    }
  }
  return;
}

Assistant:

static void Fweb(sunrealtype tcalc, N_Vector cc, N_Vector crate, UserData webdata)
{
  sunindextype jx, jy, is, idyu, idyl, idxu, idxl;
  sunrealtype xx, yy, *cxy, *ratesxy, *cratexy, dcyli, dcyui, dcxli, dcxui;

  /* Loop over grid points, evaluate interaction vector (length ns),
     form diffusion difference terms, and load crate.                    */

  for (jy = 0; jy < MY; jy++)
  {
    yy   = (webdata->dy) * jy;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;
    idyl = (jy != 0) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = (webdata->dx) * jx;
      idxu    = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;
      idxl    = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      cxy     = IJ_Vptr(cc, jx, jy);
      ratesxy = IJ_Vptr(webdata->rates, jx, jy);
      cratexy = IJ_Vptr(crate, jx, jy);

      /* Get interaction vector at this grid point. */
      WebRates(xx, yy, cxy, ratesxy, webdata);

      /* Loop over species, do differencing, load crate segment. */
      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in y. */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in x. */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxui = *(cxy + idxu + is) - *(cxy + is);

        /* Compute the crate values at (xx,yy). */
        cratexy[is] = coy[is] * (dcyui - dcyli) + cox[is] * (dcxui - dcxli) +
                      ratesxy[is];

      } /* End is loop */
    }   /* End of jx loop */
  }     /* End of jy loop */
}